

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::SetRepeatedString
          (Reflection *this,Message *message,FieldDescriptor *field,int index,string *value)

{
  string_view src;
  int iVar1;
  FieldDescriptor *field_00;
  FieldDescriptor *message_00;
  bool bVar2;
  CppType CVar3;
  int number;
  CppStringType CVar4;
  Reflection *pRVar5;
  Descriptor *actual;
  Descriptor *pDVar6;
  ExtensionSet *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  Cord local_70 [2];
  string local_50;
  string *local_30;
  string *value_local;
  FieldDescriptor *pFStack_20;
  int index_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  local_30 = value;
  value_local._4_4_ = index;
  pFStack_20 = field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  pRVar5 = Message::GetReflection(message);
  if (this != pRVar5) {
    pDVar6 = this->descriptor_;
    actual = Message::GetDescriptor((Message *)field_local);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar6,actual,pFStack_20,"SetRepeatedString");
  }
  pDVar6 = FieldDescriptor::containing_type(pFStack_20);
  if (pDVar6 != this->descriptor_) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,pFStack_20,"SetRepeatedString","Field does not match message type."
              );
  }
  bVar2 = FieldDescriptor::is_repeated(pFStack_20);
  if (!bVar2) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,pFStack_20,"SetRepeatedString",
               "Field is singular; the method requires a repeated field.");
  }
  CVar3 = FieldDescriptor::cpp_type(pFStack_20);
  if (CVar3 != CPPTYPE_STRING) {
    anon_unknown_6::ReportReflectionUsageTypeError
              (this->descriptor_,pFStack_20,"SetRepeatedString",CPPTYPE_STRING);
  }
  bVar2 = FieldDescriptor::is_extension(pFStack_20);
  if (bVar2) {
    this_00 = MutableExtensionSet(this,(Message *)field_local);
    number = FieldDescriptor::number(pFStack_20);
    iVar1 = value_local._4_4_;
    std::__cxx11::string::string((string *)&local_50,(string *)value);
    internal::ExtensionSet::SetRepeatedString(this_00,number,iVar1,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    return;
  }
  CVar4 = FieldDescriptor::cpp_string_type(pFStack_20);
  message_00 = field_local;
  field_00 = pFStack_20;
  iVar1 = value_local._4_4_;
  if (CVar4 != kView) {
    if (CVar4 == kCord) {
      src = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)value);
      absl::lts_20250127::Cord::Cord(local_70,src);
      SetRepeatedField<absl::lts_20250127::Cord>(this,(Message *)message_00,field_00,iVar1,local_70)
      ;
      absl::lts_20250127::Cord::~Cord(local_70);
      return;
    }
    if (CVar4 != kString) {
      return;
    }
  }
  pbVar7 = MutableRepeatedField<std::__cxx11::string>
                     (this,(Message *)field_local,pFStack_20,value_local._4_4_);
  std::__cxx11::string::assign((string *)pbVar7);
  return;
}

Assistant:

void Reflection::SetRepeatedString(Message* message,
                                   const FieldDescriptor* field, int index,
                                   std::string value) const {
  USAGE_MUTABLE_CHECK_ALL(SetRepeatedString, REPEATED, STRING);
  if (field->is_extension()) {
    MutableExtensionSet(message)->SetRepeatedString(field->number(), index,
                                                    std::move(value));
  } else {
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        SetRepeatedField<absl::Cord>(message, field, index, absl::Cord(value));
        break;
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString:
        MutableRepeatedField<std::string>(message, field, index)
            ->assign(std::move(value));
        break;
    }
  }
}